

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_fma.cpp
# Opt level: O0

void ncnn::binary_op_scalar_inplace(Mat *a,float b,int op_type,Option *opt)

{
  long lVar1;
  long lVar2;
  long *in_RDI;
  float *ptr;
  int q;
  int size;
  int channels;
  Mat *m;
  int in_stack_fffffffffffffeb4;
  float *in_stack_fffffffffffffec8;
  int local_cc;
  
  lVar1 = in_RDI[7];
  for (local_cc = 0; local_cc < (int)lVar1; local_cc = local_cc + 1) {
    lVar2 = *in_RDI + in_RDI[8] * (long)local_cc * in_RDI[2];
    binary_op_vector((float *)&stack0xfffffffffffffee0,in_stack_fffffffffffffec8,
                     (float *)&stack0xfffffffffffffee0,(int)((ulong)lVar2 >> 0x20),(int)(float)lVar2
                     ,in_stack_fffffffffffffeb4,0,0);
  }
  return;
}

Assistant:

static void binary_op_scalar_inplace(Mat& a, float b, int op_type, const Option& opt)
{
    const int channels = a.c;
    const int size = a.w * a.h * a.d * a.elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = a.channel(q);

        binary_op_vector(ptr, &b, ptr, size, 1, 1, 1, op_type);
    }
}